

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_isvalid.cpp
# Opt level: O3

bool __thiscall ON_Brep::IsValidVertexGeometry(ON_Brep *this,int vertex_index,ON_TextLog *text_log)

{
  ON_BrepVertex *pOVar1;
  bool bVar2;
  
  if (vertex_index < 0 ||
      (this->m_V).super_ON_ObjectArray<ON_BrepVertex>.super_ON_ClassArray<ON_BrepVertex>.m_count <=
      vertex_index) {
    if (text_log != (ON_TextLog *)0x0) {
      ON_TextLog::Print(text_log,
                        "brep vertex_index = %d (should be >=0 and <%d=brep.m_V.Count() ).\n",
                        (ulong)(uint)vertex_index);
      return false;
    }
  }
  else {
    pOVar1 = (this->m_V).super_ON_ObjectArray<ON_BrepVertex>.super_ON_ClassArray<ON_BrepVertex>.m_a;
    if (pOVar1[(uint)vertex_index].m_vertex_index == vertex_index) {
      bVar2 = ON_3dPoint::IsValid(&pOVar1[(uint)vertex_index].super_ON_Point.point);
      if (bVar2) {
        return true;
      }
      if (text_log == (ON_TextLog *)0x0) {
        return false;
      }
      ON_TextLog::Print(text_log,"brep.m_V[%d] vertex geometry is not valid.\n",
                        (ulong)(uint)vertex_index);
      ON_TextLog::PushIndent(text_log);
      ON_TextLog::Print(text_log,"vertex.point = (%g,%g,%g) is not valid.\n",
                        pOVar1[(uint)vertex_index].super_ON_Point.point.x,
                        pOVar1[(uint)vertex_index].super_ON_Point.point.y,
                        pOVar1[(uint)vertex_index].super_ON_Point.point.z);
    }
    else {
      if (text_log == (ON_TextLog *)0x0) {
        return false;
      }
      ON_TextLog::Print(text_log,"brep.m_V[%d] vertex is not valid.\n",(ulong)(uint)vertex_index);
      ON_TextLog::PushIndent(text_log);
      ON_TextLog::Print(text_log,"vertex.m_vertex_index = %d (should be %d).\n",
                        (ulong)(uint)pOVar1[(uint)vertex_index].m_vertex_index,
                        (ulong)(uint)vertex_index);
    }
    ON_TextLog::PopIndent(text_log);
  }
  return false;
}

Assistant:

bool
ON_Brep::IsValidVertexGeometry( int vertex_index, ON_TextLog* text_log ) const
{
  if ( vertex_index < 0 || vertex_index >= m_V.Count() )
  {
    if ( text_log )
      text_log->Print("brep vertex_index = %d (should be >=0 and <%d=brep.m_V.Count() ).\n",
                      vertex_index, m_V.Count());
    return false;
  }
  const ON_BrepVertex& vertex = m_V[vertex_index];
  if ( vertex.m_vertex_index != vertex_index )
  {
    if ( text_log )
    {
      text_log->Print("brep.m_V[%d] vertex is not valid.\n",vertex_index);
      text_log->PushIndent();
      text_log->Print("vertex.m_vertex_index = %d (should be %d).\n",
                       vertex.m_vertex_index, vertex_index );
      text_log->PopIndent();
    }
    return false;
  }

  if ( !vertex.point.IsValid() )
  {
    if ( text_log )
    {
      text_log->Print("brep.m_V[%d] vertex geometry is not valid.\n",vertex_index);
      text_log->PushIndent();
      text_log->Print("vertex.point = (%g,%g,%g) is not valid.\n",vertex.point.x,vertex.point.y,vertex.point.z );
      text_log->PopIndent();
    }
    return false;
  }
  return true;
}